

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_h265d_com.c
# Opt level: O3

RK_S32 hal_h265d_slice_output_rps(void *dxva,void *rps_buf)

{
  ushort uVar1;
  ushort uVar2;
  undefined1 uVar3;
  RK_U64 *ptr;
  byte bVar4;
  MPP_RET MVar5;
  RK_S32 num_bits;
  RK_S32 RVar6;
  RK_U32 len;
  void *pvVar7;
  byte bVar8;
  undefined1 *puVar9;
  char *pcVar10;
  bool bVar11;
  uint uVar12;
  SliceType_conflict SVar13;
  int iVar14;
  long lVar15;
  RefPicList_t *ref_00;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  SliceType_conflict SVar19;
  long lVar20;
  void *pvVar21;
  bool bVar22;
  RK_S32 _out;
  BitReadCtx_t gb_cxt;
  RefPicListTab_t ref;
  RK_U8 lowdelay_flag [600];
  RK_U8 rps_bit_offset [600];
  RK_U8 slice_nb_rps_poc [600];
  RK_U8 rps_bit_offset_st [600];
  slice_ref_map_t rps_pic_info [600] [2] [15];
  SliceType_conflict local_9a44;
  SliceType_conflict local_9a40;
  SliceType_conflict local_9a3c;
  void *local_9a38;
  RK_U64 *local_9a30;
  void *local_9a28;
  int local_9a20;
  int local_9a1c;
  BitReadCtx_t local_9a18;
  undefined1 *local_99c0;
  long local_99b8;
  void *local_99b0;
  SliceHeader_t local_99a8;
  RefPicList_t local_96e0 [2];
  byte local_9658 [608];
  byte local_93f8 [608];
  byte local_9198 [608];
  byte local_8f38 [608];
  undefined1 local_8cd8;
  undefined1 local_8cd7 [36007];
  
  local_99c0 = &local_8cd8;
  local_99b0 = rps_buf;
  memset(local_99c0,0,36000);
  memset(local_9198,0,600);
  memset(local_93f8,0,600);
  memset(local_8f38,0,600);
  pvVar7 = memset(local_9658,0,600);
  if (*(int *)((long)dxva + 0x1e54) == 0) {
    pvVar7 = (void *)0x1;
  }
  else {
    uVar18 = 0;
    local_9a38 = (void *)0x0;
    local_9a28 = pvVar7;
    do {
      memset(&local_99a8,0,0x2c8);
      local_9a30 = (RK_U64 *)uVar18;
      mpp_set_bitread_ctx(&local_9a18,
                          (RK_U8 *)((ulong)*(uint *)(*(long *)((long)dxva + 0x1e58) + uVar18 * 0xc)
                                   + *(long *)((long)dxva + 0x1e60)),
                          *(RK_S32 *)(*(long *)((long)dxva + 0x1e58) + 4 + uVar18 * 0xc));
      mpp_set_bitread_pseudo_code_type(&local_9a18,PSEUDO_CODE_H264_H265);
      local_9a18.ret = mpp_read_bits(&local_9a18,1,(RK_S32 *)&local_9a44);
      if (local_9a18.ret != MPP_OK) {
        return -0x3ec;
      }
      if (local_9a44 != B_SLICE) {
        return -0x3ec;
      }
      local_9a18.ret = mpp_read_bits(&local_9a18,6,(RK_S32 *)&local_9a44);
      SVar19 = local_9a44;
      if (local_9a18.ret != MPP_OK) {
        return -0x3ec;
      }
      local_9a28 = (void *)(ulong)local_9a44;
      if (local_9a44 < 0x18) {
        local_9a18.ret = mpp_skip_longbits(&local_9a18,9);
        if (local_9a18.ret != MPP_OK) {
          return -0x3ec;
        }
        local_9a18.ret = mpp_read_bits(&local_9a18,1,(RK_S32 *)&local_9a44);
        if (local_9a18.ret != MPP_OK) {
          return -0x3ec;
        }
        uVar3 = (undefined1)local_9a44;
        local_99a8.first_slice_in_pic_flag = (undefined1)local_9a44;
        if (0xf < SVar19) {
          MVar5 = mpp_read_bits(&local_9a18,1,(RK_S32 *)&local_9a44);
          if (MVar5 != MPP_OK) {
            return -0x3ec;
          }
          local_99a8.no_output_of_prior_pics_flag = (undefined1)local_9a44;
        }
        local_9a18.ret = MPP_OK;
        local_9a18.ret = mpp_read_ue(&local_9a18,&local_9a44);
        if (local_9a18.ret != MPP_OK) {
          return -0x3ec;
        }
        local_99a8.pps_id = local_9a44;
        if (0x3f < local_9a44) {
          pcVar10 = "PPS id out of range: %d\n";
          goto LAB_001fabb5;
        }
        local_99a8.dependent_slice_segment_flag = B_SLICE;
        if (uVar3 == B_SLICE) {
          bVar8 = *(char *)((long)dxva + 8) + 3;
          uVar1 = *dxva;
          bVar4 = *(char *)((long)dxva + 8) + *(char *)((long)dxva + 9) + 3;
          uVar2 = *(ushort *)((long)dxva + 2);
          uVar12 = ~(-1 << (bVar4 & 0x1f));
          bVar22 = true;
          if ((*(byte *)((long)dxva + 0x1a) & 0x10) != 0) {
            MVar5 = mpp_read_bits(&local_9a18,1,(RK_S32 *)&local_9a44);
            if (MVar5 != MPP_OK) {
              return -0x3ec;
            }
            local_99a8.dependent_slice_segment_flag = (undefined1)local_9a44;
            bVar22 = (undefined1)local_9a44 == B_SLICE;
          }
          local_9a18.ret = MPP_OK;
          SVar19 = ((int)(((uint)uVar1 << (bVar8 & 0x1f)) + uVar12) >> (bVar4 & 0x1f)) *
                   ((int)(uVar12 + ((uint)uVar2 << (bVar8 & 0x1f))) >> (bVar4 & 0x1f));
          RVar6 = mpp_log2(SVar19 * 2 - 2);
          MVar5 = mpp_read_bits(&local_9a18,RVar6,(RK_S32 *)&local_9a44);
          if (MVar5 != MPP_OK) {
            return -0x3ec;
          }
          local_99a8.slice_segment_addr = local_9a44;
          if (SVar19 <= local_9a44) {
            pcVar10 = "Invalid slice segment address: %u.\n";
            goto LAB_001fabb5;
          }
          if (!bVar22) {
            local_9a18.ret = MPP_OK;
            goto LAB_001fa092;
          }
          local_99a8.slice_addr = local_9a44;
          local_9a38 = (void *)(ulong)((int)local_9a38 + 1);
        }
        else {
          local_99a8.slice_segment_addr = 0;
          local_99a8.slice_addr = 0;
          local_9a38 = (void *)0x0;
        }
        if ((*(ushort *)((long)dxva + 0x1a) & 0x1c0) != 0) {
          uVar12 = 0;
          do {
            local_9a18.ret = MPP_OK;
            MVar5 = mpp_skip_longbits(&local_9a18,1);
            if (MVar5 != MPP_OK) {
              return -0x3ec;
            }
            uVar12 = uVar12 + 1;
          } while (uVar12 < (*(uint *)((long)dxva + 0x18) >> 0x16 & 7));
        }
        local_9a18.ret = MPP_OK;
        local_9a18.ret = mpp_read_ue(&local_9a18,&local_9a44);
        if (local_9a18.ret != MPP_OK) {
          return -0x3ec;
        }
        local_99a8.slice_type = local_9a44;
        local_9a3c = local_9a44;
        if (I_SLICE < local_9a44) {
          pcVar10 = "Unknown slice type: %d.\n";
LAB_001fabb5:
          local_9a18.ret = MPP_OK;
          _mpp_log_l(2,"hal_h265d_com",pcVar10,(char *)0x0,(ulong)local_9a44);
          return -0x3ec;
        }
        if ((*(byte *)((long)dxva + 0x1a) & 0x20) != 0) {
          MVar5 = mpp_read_bits(&local_9a18,1,(RK_S32 *)&local_9a44);
          if (MVar5 != MPP_OK) {
            return -0x3ec;
          }
          local_99a8.pic_output_flag = (undefined1)local_9a44;
        }
        local_9a18.ret = MPP_OK;
        if ((*(byte *)((long)dxva + 4) & 4) != 0) {
          MVar5 = mpp_read_bits(&local_9a18,2,(RK_S32 *)&local_9a44);
          if (MVar5 != MPP_OK) {
            return -0x3ec;
          }
          local_99a8.colour_plane_id = (undefined1)local_9a44;
        }
        local_9a18.ret = MPP_OK;
        if ((int)local_9a28 - 0x13U < 2) {
          local_99a8.short_term_rps = (ShortTermRPS_conflict *)0x0;
        }
        else {
          local_9a18.ret =
               mpp_read_bits(&local_9a18,(*(uint *)((long)dxva + 4) >> 9 & 0xf) + 4,
                             (RK_S32 *)&local_9a44);
          if (local_9a18.ret != MPP_OK) {
            return -0x3ec;
          }
          local_99a8.pic_order_cnt_lsb = local_9a44;
          local_9a18.ret = mpp_read_bits(&local_9a18,1,(RK_S32 *)&local_9a44);
          RVar6 = local_9a18.used_bits;
          if (local_9a18.ret != MPP_OK) {
            return -0x3ec;
          }
          if (local_9a44 == B_SLICE) {
            local_9a18.ret = mpp_skip_longbits(&local_9a18,(uint)*(ushort *)((long)dxva + 0x14));
LAB_001fa3cb:
            if (local_9a18.ret != MPP_OK) {
              return -0x3ec;
            }
          }
          else {
            if (*(byte *)((long)dxva + 0xe) == 0) {
              pcVar10 = "No ref lists in the SPS.\n";
              local_9a18.ret = MPP_OK;
              goto LAB_001fac15;
            }
            num_bits = mpp_log2((uint)*(byte *)((long)dxva + 0xe) * 2 - 2);
            if (0 < num_bits) {
              local_9a18.ret = mpp_read_bits(&local_9a18,num_bits,(RK_S32 *)&local_9a44);
              goto LAB_001fa3cb;
            }
          }
          iVar14 = local_9a18.used_bits - RVar6;
          lVar15 = (long)(int)local_9a38;
          local_8f38[lVar15] = (byte)iVar14;
          local_93f8[lVar15] = (byte)iVar14;
          uVar12 = *(uint *)((long)dxva + 0x18);
          if ((uVar12 >> 0x11 & 1) != 0) {
            local_9a20 = local_9a18.used_bits;
            local_9a1c = iVar14;
            local_99b8 = lVar15;
            if (*(char *)((long)dxva + 0xf) == '\0') {
              SVar19 = B_SLICE;
            }
            else {
              MVar5 = mpp_read_ue(&local_9a18,&local_9a44);
              if (MVar5 != MPP_OK) {
                return -0x3ec;
              }
              local_9a18.ret = MPP_OK;
              SVar19 = local_9a44;
            }
            MVar5 = mpp_read_ue(&local_9a18,&local_9a44);
            if (MVar5 != MPP_OK) {
              return -0x3ec;
            }
            local_9a40 = local_9a44 + SVar19;
            local_9a18.ret = MPP_OK;
            if (local_9a40 != B_SLICE) {
              SVar13 = B_SLICE;
              local_9a18.ret = MPP_OK;
              do {
                if (SVar13 < SVar19) {
                  if (1 < *(byte *)((long)dxva + 0xf)) {
                    RVar6 = mpp_log2((uint)*(byte *)((long)dxva + 0xf) * 2 - 2);
                    local_9a18.ret = mpp_read_bits(&local_9a18,RVar6,(RK_S32 *)&local_9a44);
                    goto LAB_001fa4c0;
                  }
                }
                else {
                  local_9a18.ret =
                       mpp_skip_longbits(&local_9a18,(*(uint *)((long)dxva + 4) >> 9 & 0xf) + 4);
                  if (local_9a18.ret != MPP_OK) {
                    return -0x3ec;
                  }
                  local_9a18.ret = mpp_skip_longbits(&local_9a18,1);
LAB_001fa4c0:
                  if (local_9a18.ret != MPP_OK) {
                    return -0x3ec;
                  }
                }
                local_9a18.ret = mpp_read_bits(&local_9a18,1,(RK_S32 *)&local_9a44);
                if (local_9a18.ret != MPP_OK) {
                  return -0x3ec;
                }
                MVar5 = MPP_OK;
                if (((undefined1)local_9a44 != B_SLICE) &&
                   (MVar5 = mpp_read_ue(&local_9a18,&local_9a44), MVar5 != MPP_OK)) {
                  return -0x3ec;
                }
                local_9a18.ret = MVar5;
                SVar13 = SVar13 + P_SLICE;
              } while (local_9a40 != SVar13);
            }
            local_93f8[local_99b8] =
                 ((char)local_9a18.used_bits - (char)local_9a20) + (char)local_9a1c;
            uVar12 = *(uint *)((long)dxva + 0x18);
          }
          if ((uVar12 >> 0x12 & 1) == 0) {
            local_99a8.slice_temporal_mvp_enabled_flag = B_SLICE;
          }
          else {
            MVar5 = mpp_read_bits(&local_9a18,1,(RK_S32 *)&local_9a44);
            if (MVar5 != MPP_OK) {
              return -0x3ec;
            }
            local_99a8.slice_temporal_mvp_enabled_flag = (undefined1)local_9a44;
            local_9a18.ret = MPP_OK;
          }
        }
        if ((*(byte *)((long)dxva + 0x18) & 4) == 0) {
          local_99a8.slice_sample_adaptive_offset_flag[0] = '\0';
          local_99a8.slice_sample_adaptive_offset_flag[1] = '\0';
          local_99a8.slice_sample_adaptive_offset_flag[2] = B_SLICE;
        }
        else {
          local_9a18.ret = mpp_read_bits(&local_9a18,1,(RK_S32 *)&local_9a44);
          if (local_9a18.ret != MPP_OK) {
            return -0x3ec;
          }
          local_99a8.slice_sample_adaptive_offset_flag[0] = (undefined1)local_9a44;
          MVar5 = mpp_read_bits(&local_9a18,1,(RK_S32 *)&local_9a44);
          if (MVar5 != MPP_OK) {
            return -0x3ec;
          }
          local_99a8.slice_sample_adaptive_offset_flag[1] = (undefined1)local_9a44;
          local_9a18.ret = MPP_OK;
          local_99a8.slice_sample_adaptive_offset_flag[2] = (undefined1)local_9a44;
        }
        local_99a8.nb_refs[0] = 0;
        local_99a8.nb_refs[1] = 0;
        if (local_9a3c != I_SLICE) {
          local_9a40 = *(byte *)((long)dxva + 0x10) + P_SLICE;
          local_99a8.nb_refs[1] = 0;
          local_99a8.nb_refs[0] = local_9a40;
          uVar12 = 0;
          if (local_9a3c == B_SLICE) {
            uVar12 = *(byte *)((long)dxva + 0x11) + 1;
            local_99a8.nb_refs[1] = uVar12;
          }
          local_9a18.ret = mpp_read_bits(&local_9a18,1,(RK_S32 *)&local_9a44);
          if (local_9a18.ret != MPP_OK) {
            return -0x3ec;
          }
          SVar19 = local_9a40;
          if (local_9a44 != B_SLICE) {
            local_9a18.ret = mpp_read_ue(&local_9a18,&local_9a44);
            if (local_9a18.ret != MPP_OK) {
              return -0x3ec;
            }
            SVar19 = local_9a44 + P_SLICE;
            local_99a8.nb_refs[0] = SVar19;
            if (local_9a3c == B_SLICE) {
              MVar5 = mpp_read_ue(&local_9a18,&local_9a44);
              if (MVar5 != MPP_OK) {
                return -0x3ec;
              }
              uVar12 = local_9a44 + P_SLICE;
              local_99a8.nb_refs[1] = uVar12;
            }
          }
          local_9a18.ret = MPP_OK;
          if ((0x10 < SVar19) || (0x10 < uVar12)) {
            _mpp_log_l(2,"hal_h265d_com","Too many refs: %d/%d.\n",(char *)0x0,(ulong)SVar19,
                       (ulong)uVar12);
            return -0x3ec;
          }
          local_99a8.rpl_modification_flag[0] = '\0';
          local_99a8.rpl_modification_flag[1] = '\0';
          iVar14 = 0;
          lVar15 = 0x7c;
          local_9a40 = SVar19;
          do {
            if (*(char *)((long)dxva + lVar15) != -1) {
              if (((byte)hal_h265d_debug & 2) != 0) {
                _mpp_log_l(4,"hal_h265d_com","dxva_cxt->pp.RefPicList[i].bPicEntry = %d",(char *)0x0
                          );
              }
              iVar14 = iVar14 + 1;
            }
            lVar15 = lVar15 + 1;
          } while (lVar15 != 0x8b);
          if (iVar14 == 0) {
            pcVar10 = "Zero refs for a frame with P or B slices.\n";
LAB_001fac15:
            _mpp_log_l(2,"hal_h265d_com",pcVar10,(char *)0x0);
            return -0x3ec;
          }
          if ((iVar14 != 1 & *(byte *)((long)dxva + 0x1d) >> 6) == 1) {
            MVar5 = mpp_read_bits(&local_9a18,1,(RK_S32 *)&local_9a44);
            if (MVar5 != MPP_OK) {
              return -0x3ec;
            }
            local_99a8.rpl_modification_flag[0] = (undefined1)local_9a44;
            if (((undefined1)local_9a44 != B_SLICE) && (local_9a40 != B_SLICE)) {
              local_9a40 = iVar14 * 2 - I_SLICE;
              uVar18 = 0;
              do {
                local_9a18.ret = MPP_OK;
                RVar6 = mpp_log2(local_9a40);
                MVar5 = mpp_read_bits(&local_9a18,RVar6,(RK_S32 *)&local_9a44);
                if (MVar5 != MPP_OK) {
                  return -0x3ec;
                }
                local_99a8.list_entry_lx[0][uVar18] = local_9a44;
                uVar18 = uVar18 + 1;
              } while (uVar18 < ((ulong)local_99a8.nb_refs & 0xffffffff));
            }
            local_9a18.ret = MPP_OK;
            if (local_9a3c == B_SLICE) {
              MVar5 = mpp_read_bits(&local_9a18,1,(RK_S32 *)&local_9a44);
              if (MVar5 != MPP_OK) {
                return -0x3ec;
              }
              local_99a8.rpl_modification_flag[1] = (undefined1)local_9a44;
              local_9a3c = B_SLICE;
              local_9a18.ret = MPP_OK;
              if (((undefined1)local_9a44 == P_SLICE) && (local_99a8.nb_refs[1] != 0)) {
                local_9a40 = iVar14 * 2 - I_SLICE;
                uVar18 = 0;
                do {
                  local_9a18.ret = MPP_OK;
                  RVar6 = mpp_log2(local_9a40);
                  MVar5 = mpp_read_bits(&local_9a18,RVar6,(RK_S32 *)&local_9a44);
                  if (MVar5 != MPP_OK) {
                    return -0x3ec;
                  }
                  local_99a8.list_entry_lx[1][uVar18] = local_9a44;
                  uVar18 = uVar18 + 1;
                  local_9a18.ret = MPP_OK;
                } while (uVar18 < (ulong)local_99a8.nb_refs >> 0x20);
              }
            }
          }
          if (local_9a3c != I_SLICE) {
            ref_00 = local_96e0;
            hal_h265d_slice_rpl(dxva,&local_99a8,(RefPicListTab_t *)ref_00);
            lVar15 = (long)(int)local_9a38;
            local_9658[lVar15] = 1;
            puVar9 = local_8cd7 + lVar15 * 0x3c;
            uVar18 = 0;
            do {
              uVar12 = local_96e0[uVar18].nb_refs;
              if ((ulong)uVar12 != 0) {
                uVar16 = 0;
                do {
                  bVar4 = (byte)((RefPicList_t *)ref_00->dpb_index)->dpb_index[uVar16];
                  uVar17 = (ulong)bVar4;
                  if (uVar17 != 0xff) {
                    puVar9[uVar16 * 2 + -1] = bVar4;
                    puVar9[uVar16 * 2] = *(byte *)((long)dxva + uVar17 + 0x7c) >> 7;
                    if (*(int *)((long)dxva + 0x78) < *(int *)((long)dxva + uVar17 * 4 + 0x8c)) {
                      local_9658[lVar15] = 0;
                    }
                  }
                  uVar16 = uVar16 + 1;
                } while (uVar12 != uVar16);
              }
              uVar18 = uVar18 + 1;
              ref_00 = ref_00 + 1;
              puVar9 = puVar9 + 0x1e;
            } while (uVar18 != 2 - local_9a3c);
            local_9198[lVar15] = (byte)iVar14;
          }
        }
      }
      else {
        local_9a18.ret = MPP_OK;
      }
LAB_001fa092:
      uVar18 = (long)local_9a30 + 1;
    } while (uVar18 < *(uint *)((long)dxva + 0x1e54));
    pvVar7 = (void *)(ulong)((int)local_9a38 + 1);
  }
  len = (int)pvVar7 * 4 + 1;
  local_9a30 = (RK_U64 *)mpp_osal_malloc("hal_h265d_slice_output_rps",(long)(int)len * 8);
  mpp_set_bitput_ctx((BitputCtx_t *)local_96e0,local_9a30,len);
  local_9a38 = pvVar7;
  if ((int)pvVar7 != 0) {
    pvVar21 = (void *)0x0;
    local_9a28 = pvVar7;
    do {
      bVar4 = 0;
      lVar15 = 0;
      bVar22 = true;
      do {
        bVar11 = bVar22;
        puVar9 = local_99c0;
        lVar20 = 0;
        do {
          mpp_put_bits((BitputCtx_t *)local_96e0,(ulong)(byte)puVar9[lVar20 * 2 + lVar15 * 0x1e + 1]
                       ,1);
          if (!(bool)(lVar20 != 4 | ~bVar4 & 1)) {
            mpp_put_align((BitputCtx_t *)local_96e0,0x40,0);
          }
          mpp_put_bits((BitputCtx_t *)local_96e0,(ulong)(byte)puVar9[lVar20 * 2 + lVar15 * 0x1e],4);
          lVar20 = lVar20 + 1;
        } while (lVar20 != 0xf);
        lVar15 = 1;
        bVar4 = 1;
        bVar22 = false;
      } while (bVar11);
      bVar4 = local_9658[(long)pvVar21];
      mpp_put_bits((BitputCtx_t *)local_96e0,(ulong)bVar4,1);
      if (((byte)hal_h265d_debug & 2) != 0) {
        _mpp_log_l(4,"hal_h265d_com","lowdelay_flag = %d \n",(char *)0x0,(ulong)bVar4);
      }
      bVar4 = local_93f8[(long)pvVar21];
      mpp_put_bits((BitputCtx_t *)local_96e0,(ulong)bVar4,10);
      if (((byte)hal_h265d_debug & 2) != 0) {
        _mpp_log_l(4,"hal_h265d_com","rps_bit_offset = %d \n",(char *)0x0,(ulong)bVar4);
      }
      bVar4 = local_8f38[(long)pvVar21];
      mpp_put_bits((BitputCtx_t *)local_96e0,(ulong)bVar4,9);
      if (((byte)hal_h265d_debug & 2) != 0) {
        _mpp_log_l(4,"hal_h265d_com","rps_bit_offset_st = %d \n",(char *)0x0,(ulong)bVar4);
      }
      bVar4 = local_9198[(long)pvVar21];
      mpp_put_bits((BitputCtx_t *)local_96e0,(ulong)bVar4,4);
      if (((byte)hal_h265d_debug & 2) != 0) {
        _mpp_log_l(4,"hal_h265d_com","slice_nb_rps_poc = %d \n",(char *)0x0,(ulong)bVar4);
      }
      mpp_put_align((BitputCtx_t *)local_96e0,0x40,0);
      pvVar21 = (void *)((long)pvVar21 + 1);
      local_99c0 = local_99c0 + 0x3c;
    } while (pvVar21 != local_9a28);
  }
  ptr = local_9a30;
  if (local_99b0 != (void *)0x0) {
    memcpy(local_99b0,local_9a30,(long)((int)local_9a38 << 5));
  }
  mpp_osal_free("hal_h265d_slice_output_rps",ptr);
  return 0;
}

Assistant:

RK_S32 hal_h265d_slice_output_rps(void *dxva, void *rps_buf)
{
    RK_U32 i, j, k;
    RK_S32 value;
    RK_U32 nal_type;
    RK_S32 slice_idx = 0;
    BitReadCtx_t gb_cxt, *gb;
    SliceHeader_t sh;
    RK_U8     rps_bit_offset[600];
    RK_U8     rps_bit_offset_st[600];
    RK_U8     slice_nb_rps_poc[600];
    RK_U8     lowdelay_flag[600];
    slice_ref_map_t rps_pic_info[600][2][15];
    RK_U32    nb_refs = 0;
    RK_S32    bit_begin;
    h265d_dxva2_picture_context_t *dxva_cxt = NULL;

    memset(&rps_pic_info,   0, sizeof(rps_pic_info));
    memset(&slice_nb_rps_poc, 0, sizeof(slice_nb_rps_poc));
    memset(&rps_bit_offset, 0, sizeof(rps_bit_offset));
    memset(&rps_bit_offset_st, 0, sizeof(rps_bit_offset_st));
    memset(&lowdelay_flag, 0, sizeof(lowdelay_flag));

    dxva_cxt = (h265d_dxva2_picture_context_t*)dxva;
    for (k = 0; k < dxva_cxt->slice_count; k++) {
        RefPicListTab_t ref;
        memset(&sh, 0, sizeof(SliceHeader_t));
        // mpp_err("data[%d]= 0x%x,size[%d] = %d \n",
        //   k,dxva_cxt->slice_short[k].BSNALunitDataLocation, k,dxva_cxt->slice_short[k].SliceBytesInBuffer);
        mpp_set_bitread_ctx(&gb_cxt, (RK_U8*)(dxva_cxt->bitstream + dxva_cxt->slice_short[k].BSNALunitDataLocation),
                            dxva_cxt->slice_short[k].SliceBytesInBuffer);

        mpp_set_bitread_pseudo_code_type(&gb_cxt, PSEUDO_CODE_H264_H265);
        gb = &gb_cxt;

        READ_ONEBIT(gb, &value);

        if ( value != 0)
            return  MPP_ERR_STREAM;

        READ_BITS(gb, 6, &nal_type);

        if (nal_type > 23) {
            continue;
        }

        SKIP_BITS(gb, 9);

        READ_ONEBIT(gb, &sh.first_slice_in_pic_flag);

        if (nal_type >= 16 && nal_type <= 23)
            READ_ONEBIT(gb, &sh.no_output_of_prior_pics_flag);

        READ_UE(gb, &sh.pps_id);

        if (sh.pps_id >= 64 ) {
            mpp_err( "PPS id out of range: %d\n", sh.pps_id);
            return  MPP_ERR_STREAM;
        }

        sh.dependent_slice_segment_flag = 0;
        if (!sh.first_slice_in_pic_flag) {
            RK_S32 slice_address_length;
            RK_S32 width, height, ctb_width, ctb_height;
            RK_S32 log2_min_cb_size = dxva_cxt->pp.log2_min_luma_coding_block_size_minus3 + 3;
            RK_S32 log2_ctb_size = log2_min_cb_size + dxva_cxt->pp.log2_diff_max_min_luma_coding_block_size;

            width = (dxva_cxt->pp.PicWidthInMinCbsY << log2_min_cb_size);
            height = (dxva_cxt->pp.PicHeightInMinCbsY << log2_min_cb_size);

            ctb_width  = (width  + (1 << log2_ctb_size) - 1) >> log2_ctb_size;
            ctb_height = (height + (1 << log2_ctb_size) - 1) >> log2_ctb_size;

            if (dxva_cxt->pp.dependent_slice_segments_enabled_flag)
                READ_ONEBIT(gb, &sh.dependent_slice_segment_flag);

            slice_address_length = mpp_ceil_log2(ctb_width * ctb_height);

            READ_BITS(gb, slice_address_length, &sh.slice_segment_addr);

            if (sh.slice_segment_addr >= (RK_U32)(ctb_width * ctb_height)) {
                mpp_err(
                    "Invalid slice segment address: %u.\n",
                    sh.slice_segment_addr);
                return  MPP_ERR_STREAM;
            }

            if (!sh.dependent_slice_segment_flag) {
                sh.slice_addr = sh.slice_segment_addr;
                slice_idx++;
            }
        } else {
            sh.slice_segment_addr = sh.slice_addr = 0;
            slice_idx           = 0;
        }

        if (!sh.dependent_slice_segment_flag) {
            for (i = 0; i < dxva_cxt->pp.num_extra_slice_header_bits; i++)
                SKIP_BITS(gb, 1);

            READ_UE(gb, &sh.slice_type);
            if (!(sh.slice_type == I_SLICE ||
                  sh.slice_type == P_SLICE ||
                  sh.slice_type == B_SLICE)) {
                mpp_err( "Unknown slice type: %d.\n",
                         sh.slice_type);
                return  MPP_ERR_STREAM;
            }
            /*     if (!s->decoder_id && IS_IRAP(nal_type) && sh->slice_type != I_SLICE) {
                     mpp_err( "Inter slices in an IRAP frame.\n");
                     return  MPP_ERR_STREAM;
                 }*/

            if (dxva_cxt->pp.output_flag_present_flag)
                READ_ONEBIT(gb, &sh.pic_output_flag);

            if (dxva_cxt->pp.separate_colour_plane_flag)
                READ_BITS(gb, 2, &sh.colour_plane_id );

            if (!IS_IDR(nal_type)) {
                int short_term_ref_pic_set_sps_flag;

                READ_BITS(gb, (dxva_cxt->pp.log2_max_pic_order_cnt_lsb_minus4 + 4), &sh.pic_order_cnt_lsb);

                READ_ONEBIT(gb, &short_term_ref_pic_set_sps_flag);

                bit_begin = gb->used_bits;

                if (!short_term_ref_pic_set_sps_flag) {
                    SKIP_BITS(gb, dxva_cxt->pp.wNumBitsForShortTermRPSInSlice);
                } else {
                    RK_S32 numbits, rps_idx;
                    if (!dxva_cxt->pp.num_short_term_ref_pic_sets) {
                        mpp_err( "No ref lists in the SPS.\n");
                        return  MPP_ERR_STREAM;
                    }
                    numbits = mpp_ceil_log2(dxva_cxt->pp.num_short_term_ref_pic_sets);
                    rps_idx = 0;
                    if (numbits > 0)
                        READ_BITS(gb, numbits, &rps_idx);
                }

                rps_bit_offset_st[slice_idx] = gb->used_bits - bit_begin;
                rps_bit_offset[slice_idx] = rps_bit_offset_st[slice_idx];
                if (dxva_cxt->pp.long_term_ref_pics_present_flag) {

//                    RK_S32 max_poc_lsb    = 1 << (dxva_cxt->pp.log2_max_pic_order_cnt_lsb_minus4 + 4);
                    RK_U32 nb_sps = 0, nb_sh;

                    bit_begin = gb->used_bits;
                    if (dxva_cxt->pp.num_long_term_ref_pics_sps > 0)
                        READ_UE(gb, &nb_sps);

                    READ_UE(gb, &nb_sh);

                    nb_refs = nb_sh + nb_sps;

                    for (i = 0; i < nb_refs; i++) {
                        RK_U8 delta_poc_msb_present;

                        if ((RK_U32)i < nb_sps) {
                            RK_U8 lt_idx_sps = 0;

                            if (dxva_cxt->pp.num_long_term_ref_pics_sps > 1)
                                READ_BITS(gb, mpp_ceil_log2(dxva_cxt->pp.num_long_term_ref_pics_sps), &lt_idx_sps);
                        } else {
                            SKIP_BITS(gb, (dxva_cxt->pp.log2_max_pic_order_cnt_lsb_minus4 + 4));
                            SKIP_BITS(gb, 1);
                        }

                        READ_ONEBIT(gb, &delta_poc_msb_present);
                        if (delta_poc_msb_present) {
                            RK_S32 delta = 0;
                            READ_UE(gb, &delta);
                        }
                    }
                    rps_bit_offset[slice_idx] += (gb->used_bits - bit_begin);

                }

                if (dxva_cxt->pp.sps_temporal_mvp_enabled_flag)
                    READ_ONEBIT(gb, &sh.slice_temporal_mvp_enabled_flag);
                else
                    sh.slice_temporal_mvp_enabled_flag = 0;
            } else {
                sh.short_term_rps = NULL;
            }

            if (dxva_cxt->pp.sample_adaptive_offset_enabled_flag) {
                READ_ONEBIT(gb, &sh.slice_sample_adaptive_offset_flag[0]);
                READ_ONEBIT(gb, &sh.slice_sample_adaptive_offset_flag[1]);
                sh.slice_sample_adaptive_offset_flag[2] =
                    sh.slice_sample_adaptive_offset_flag[1];
            } else {
                sh.slice_sample_adaptive_offset_flag[0] = 0;
                sh.slice_sample_adaptive_offset_flag[1] = 0;
                sh.slice_sample_adaptive_offset_flag[2] = 0;
            }

            sh.nb_refs[L0] = sh.nb_refs[L1] = 0;
            if (sh.slice_type == P_SLICE || sh.slice_type == B_SLICE) {

                sh.nb_refs[L0] = dxva_cxt->pp.num_ref_idx_l0_default_active_minus1 + 1;
                if (sh.slice_type == B_SLICE)
                    sh.nb_refs[L1] =  dxva_cxt->pp.num_ref_idx_l1_default_active_minus1 + 1;

                READ_ONEBIT(gb, &value);

                if (value) { // num_ref_idx_active_override_flag
                    READ_UE(gb, &sh.nb_refs[L0]);
                    sh.nb_refs[L0] += 1;
                    if (sh.slice_type == B_SLICE) {
                        READ_UE(gb, &sh.nb_refs[L1]);
                        sh.nb_refs[L1] += 1;
                    }
                }
                if (sh.nb_refs[L0] > MAX_REFS || sh.nb_refs[L1] > MAX_REFS) {
                    mpp_err( "Too many refs: %d/%d.\n",
                             sh.nb_refs[L0], sh.nb_refs[L1]);
                    return  MPP_ERR_STREAM;
                }

                sh.rpl_modification_flag[0] = 0;
                sh.rpl_modification_flag[1] = 0;
                nb_refs = 0;
                for (i = 0; i < (RK_S32)MPP_ARRAY_ELEMS(dxva_cxt->pp.RefPicList); i++) {
                    if (dxva_cxt->pp.RefPicList[i].bPicEntry != 0xff) {
                        h265h_dbg(H265H_DBG_RPS, "dxva_cxt->pp.RefPicList[i].bPicEntry = %d", dxva_cxt->pp.RefPicList[i].bPicEntry);
                        nb_refs++;
                    }
                }

                if (!nb_refs) {
                    mpp_err( "Zero refs for a frame with P or B slices.\n");
                    return  MPP_ERR_STREAM;
                }

                if (dxva_cxt->pp.lists_modification_present_flag && nb_refs > 1) {
                    READ_ONEBIT(gb, &sh.rpl_modification_flag[0]);
                    if (sh.rpl_modification_flag[0]) {
                        for (i = 0; (RK_U32)i < sh.nb_refs[L0]; i++)
                            READ_BITS(gb, mpp_ceil_log2(nb_refs), &sh.list_entry_lx[0][i]);
                    }

                    if (sh.slice_type == B_SLICE) {
                        READ_ONEBIT(gb, &sh.rpl_modification_flag[1]);
                        if (sh.rpl_modification_flag[1] == 1)
                            for (i = 0; (RK_U32)i < sh.nb_refs[L1]; i++)
                                READ_BITS(gb, mpp_ceil_log2(nb_refs), &sh.list_entry_lx[1][i]);
                    }
                }
            }
        }

        if (!sh.dependent_slice_segment_flag &&
            sh.slice_type != I_SLICE) {
            RK_U32 nb_list = I_SLICE - sh.slice_type;

            hal_h265d_slice_rpl(dxva, &sh, &ref);
            lowdelay_flag[slice_idx]  =  1;

            for (j = 0; j < nb_list; j++) {
                for (i = 0; i < ref.refPicList[j].nb_refs; i++) {
                    RK_U8 index = 0;
                    index = ref.refPicList[j].dpb_index[i];
                    // mpp_err("slice_idx = %d index = %d,j = %d i = %d",slice_idx,index,j,i);
                    if (index != 0xff) {
                        rps_pic_info[slice_idx][j][i].dpb_index = index;
                        rps_pic_info[slice_idx][j][i].is_long_term
                            = dxva_cxt->pp.RefPicList[index].AssociatedFlag;
                        if (dxva_cxt->pp.PicOrderCntValList[index] > dxva_cxt->pp.CurrPicOrderCntVal)
                            lowdelay_flag[slice_idx] = 0;
                    }
                }
            }

            if (sh.slice_type == I_SLICE)
                slice_nb_rps_poc[slice_idx] = 0;
            else
                slice_nb_rps_poc[slice_idx] = nb_refs;

        }
    }
//out put for rk format
    {
        RK_S32  nb_slice = slice_idx + 1;
        RK_S32  fifo_len   = nb_slice * 4 + 1;//size of rps_packet alloc more 1 64 bit invoid buffer no enought
        RK_U64 *rps_packet = mpp_malloc(RK_U64, fifo_len);
        BitputCtx_t bp;
        mpp_set_bitput_ctx(&bp, rps_packet, fifo_len);
        for (k = 0; k < (RK_U32)nb_slice; k++) {
            for (j = 0; j < 2; j++) {
                for (i = 0; i < 15; i++) {
                    mpp_put_bits(&bp, rps_pic_info[k][j][i].is_long_term, 1);
                    if (j == 1 && i == 4) {
                        mpp_put_align (&bp, 64, 0);
                    }
                    mpp_put_bits(&bp, rps_pic_info[k][j][i].dpb_index,    4);
                }
            }
            mpp_put_bits(&bp, lowdelay_flag      [k], 1);
            h265h_dbg(H265H_DBG_RPS, "lowdelay_flag = %d \n", lowdelay_flag[k]);
            mpp_put_bits(&bp, rps_bit_offset     [k], 10);

            h265h_dbg(H265H_DBG_RPS, "rps_bit_offset = %d \n", rps_bit_offset[k]);
            mpp_put_bits(&bp, rps_bit_offset_st  [k], 9);

            h265h_dbg(H265H_DBG_RPS, "rps_bit_offset_st = %d \n", rps_bit_offset_st[k]);
            mpp_put_bits(&bp, slice_nb_rps_poc   [k], 4);

            h265h_dbg(H265H_DBG_RPS, "slice_nb_rps_poc = %d \n", slice_nb_rps_poc[k]);
            mpp_put_align   (&bp, 64, 0);
        }
        if (rps_buf != NULL) {
            memcpy(rps_buf, rps_packet, nb_slice * 32);
        }
        mpp_free(rps_packet);
    }

    return 0;
__BITREAD_ERR:
    return  MPP_ERR_STREAM;
}